

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O0

void strip_crlf(char *str)

{
  size_t sVar1;
  bool bVar2;
  char *local_18;
  char *p;
  char *str_local;
  
  sVar1 = strlen(str);
  local_18 = str + sVar1;
  while( true ) {
    bVar2 = false;
    if ((str < local_18) && (bVar2 = true, local_18[-1] != '\r')) {
      bVar2 = local_18[-1] == '\n';
    }
    if (!bVar2) break;
    local_18[-1] = '\0';
    local_18 = local_18 + -1;
  }
  return;
}

Assistant:

void strip_crlf(char *str)
{
    char *p = str + strlen(str);

    while (p > str && (p[-1] == '\r' || p[-1] == '\n'))
        *--p = '\0';
}